

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineMultipleRead.cpp
# Opt level: O0

void testDeepScanLineMultipleRead(string *tempDir)

{
  ostream *poVar1;
  char *__filename;
  string source_filename;
  char *in_stack_00000170;
  char *in_stack_000002a0;
  string local_28 [8];
  char *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\n\nTesting random re-reads from deep scanline file:\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator+(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  random_reseed(0);
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_d0d4b::make_file(in_stack_00000170);
  std::__cxx11::string::c_str();
  anon_unknown.dwarf_d0d4b::read_file(in_stack_000002a0);
  __filename = (char *)std::__cxx11::string::c_str();
  remove(__filename);
  poVar1 = std::operator<<((ostream *)&std::cout," ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void
testDeepScanLineMultipleRead (const std::string& tempDir)
{

    cout << "\n\nTesting random re-reads from deep scanline file:\n" << endl;

    std::string source_filename = tempDir + "imf_test_multiple_read";
    random_reseed (1);

    make_file (source_filename.c_str ());
    read_file (source_filename.c_str ());
    remove (source_filename.c_str ());

    cout << " ok\n" << endl;
}